

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::unoptimizedPumpTo
          (kj *this,AsyncInputStream *input,AsyncOutputStream *output,uint64_t amount,
          uint64_t completedSoFar)

{
  PromiseArena *pPVar1;
  OwnPromiseNode OVar2;
  PromiseArenaMember *in_RAX;
  PromiseArena *pPVar3;
  void *pvVar4;
  AsyncPump *ptrCopy;
  AttachmentPromiseNodeBase *this_00;
  Promise<unsigned_long> promise;
  OwnPromiseNode local_38;
  
  local_38.ptr = (PromiseNode *)in_RAX;
  pPVar3 = (PromiseArena *)operator_new(0x1020);
  *(AsyncInputStream **)pPVar3->bytes = input;
  *(AsyncOutputStream **)(pPVar3->bytes + 8) = output;
  *(uint64_t *)(pPVar3->bytes + 0x10) = amount;
  *(uint64_t *)(pPVar3->bytes + 0x18) = completedSoFar;
  anon_unknown_123::AsyncPump::pump((AsyncPump *)&stack0xffffffffffffffc8);
  OVar2.ptr = local_38.ptr;
  pPVar1 = ((local_38.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_38.ptr - (long)pPVar1) < 0x28) {
    pvVar4 = operator_new(0x400);
    this_00 = (AttachmentPromiseNodeBase *)((long)pvVar4 + 0x3d8);
    _::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,&stack0xffffffffffffffc8);
    *(undefined ***)((long)pvVar4 + 0x3d8) = &PTR_destroy_0070a3d8;
    *(undefined8 **)((long)pvVar4 + 0x3f0) =
         &_::HeapDisposer<kj::(anonymous_namespace)::AsyncPump>::instance;
    *(PromiseArena **)((long)pvVar4 + 0x3f8) = pPVar3;
    *(void **)((long)pvVar4 + 0x3e0) = pvVar4;
  }
  else {
    ((local_38.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (AttachmentPromiseNodeBase *)&local_38.ptr[-3].super_PromiseArenaMember.arena;
    _::AttachmentPromiseNodeBase::AttachmentPromiseNodeBase(this_00,&stack0xffffffffffffffc8);
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_0070a3d8;
    OVar2.ptr[-1].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::AsyncPump>::instance;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = pPVar3;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  OVar2.ptr = local_38.ptr;
  *(AttachmentPromiseNodeBase **)this = this_00;
  if (&(local_38.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_38.ptr = (PromiseNode *)0x0;
    _::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> unoptimizedPumpTo(
    AsyncInputStream& input, AsyncOutputStream& output, uint64_t amount,
    uint64_t completedSoFar) {
  auto pump = heap<AsyncPump>(input, output, amount, completedSoFar);
  auto promise = pump->pump();
  return promise.attach(kj::mv(pump));
}